

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O3

void __thiscall ddd::DictionaryMLT<true,_true>::~DictionaryMLT(DictionaryMLT<true,_true> *this)

{
  *(undefined ***)this = &PTR__DictionaryMLT_00140cb0;
  std::
  vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
  ::~vector((vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
             *)(this + 0x10));
  std::
  unique_ptr<ddd::DaTrie<true,_true,_true>,_std::default_delete<ddd::DaTrie<true,_true,_true>_>_>::
  ~unique_ptr((unique_ptr<ddd::DaTrie<true,_true,_true>,_std::default_delete<ddd::DaTrie<true,_true,_true>_>_>
               *)(this + 8));
  return;
}

Assistant:

uint32_t search_key(const char* key) const {
    Query query(key);

    if (!prefix_subtrie_->search_prefix(query)) {
      return NOT_FOUND;
    }

    if (query.is_finished()) {
      return query.value();
    }

    query.set_node_pos(ROOT_POS);
    if (!suffix_subtries_[query.value()]->search_key(query)) {
      return NOT_FOUND;
    }
    return query.value();
  }